

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-backend.cpp
# Opt level: O1

ggml_tensor *
graph_copy_dup_tensor
          (ggml_hash_set hash_set,ggml_tensor **node_copies,ggml_context *ctx_allocated,
          ggml_context *ctx_unallocated,ggml_tensor *src)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ggml_hash_set hash_set_00;
  ggml_hash_set hash_set_01;
  size_t sVar8;
  ggml_tensor *tensor;
  long lVar9;
  ggml_tensor *pgVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  int line;
  ggml_context *ctx;
  
  if (src == (ggml_tensor *)0x0) {
    pcVar11 = "src != NULL";
    line = 0x689;
  }
  else {
    if (src->data != (void *)0x0) {
      uVar12 = ((ulong)src >> 4) % hash_set.size;
      uVar13 = uVar12;
      do {
        if ((hash_set.used[uVar13 >> 5] >> ((uint)uVar13 & 0x1f) & 1) == 0) {
          hash_set.used[uVar13 >> 5] = 1 << ((byte)uVar13 & 0x1f) | hash_set.used[uVar13 >> 5];
          hash_set.keys[uVar13] = src;
LAB_0012865b:
          if (uVar13 == 0xfffffffffffffffe) {
            sVar8 = ggml_hash_find(&hash_set,src);
            tensor = node_copies[sVar8];
          }
          else {
            if ((src->data == (void *)0x0) ||
               (ctx = ctx_allocated, src->view_src != (ggml_tensor *)0x0)) {
              ctx = ctx_unallocated;
            }
            tensor = ggml_dup_tensor(ctx,src);
            lVar9 = 6;
            do {
              tensor->ne[lVar9 + -2] = src->ne[lVar9 + -2];
              lVar9 = lVar9 + 1;
            } while (lVar9 != 10);
            if (src->view_src != (ggml_tensor *)0x0) {
              hash_set_00.used = hash_set.used;
              hash_set_00.size = hash_set.size;
              hash_set_00.keys = hash_set.keys;
              pgVar10 = graph_copy_dup_tensor
                                  (hash_set_00,node_copies,ctx_allocated,ctx_unallocated,
                                   src->view_src);
              tensor->view_src = pgVar10;
              tensor->view_offs = src->view_offs;
            }
            tensor->op = src->op;
            uVar1 = *(undefined8 *)(src->op_params + 2);
            uVar2 = *(undefined8 *)(src->op_params + 4);
            uVar3 = *(undefined8 *)(src->op_params + 6);
            uVar4 = *(undefined8 *)(src->op_params + 8);
            uVar5 = *(undefined8 *)(src->op_params + 10);
            uVar6 = *(undefined8 *)(src->op_params + 0xc);
            uVar7 = *(undefined8 *)(src->op_params + 0xe);
            *(undefined8 *)tensor->op_params = *(undefined8 *)src->op_params;
            *(undefined8 *)(tensor->op_params + 2) = uVar1;
            *(undefined8 *)(tensor->op_params + 4) = uVar2;
            *(undefined8 *)(tensor->op_params + 6) = uVar3;
            *(undefined8 *)(tensor->op_params + 8) = uVar4;
            *(undefined8 *)(tensor->op_params + 10) = uVar5;
            *(undefined8 *)(tensor->op_params + 0xc) = uVar6;
            *(undefined8 *)(tensor->op_params + 0xe) = uVar7;
            ggml_set_name(tensor,src->name);
            lVar9 = 0x13;
            do {
              if ((ggml_tensor *)src->ne[lVar9 + -2] != (ggml_tensor *)0x0) {
                hash_set_01.used = hash_set.used;
                hash_set_01.size = hash_set.size;
                hash_set_01.keys = hash_set.keys;
                pgVar10 = graph_copy_dup_tensor
                                    (hash_set_01,node_copies,ctx_allocated,ctx_unallocated,
                                     (ggml_tensor *)src->ne[lVar9 + -2]);
                tensor->ne[lVar9 + -2] = (int64_t)pgVar10;
              }
              lVar9 = lVar9 + 1;
            } while (lVar9 != 0x1d);
            node_copies[uVar13] = tensor;
          }
          return tensor;
        }
        if (hash_set.keys[uVar13] == src) {
          uVar13 = 0xfffffffffffffffe;
          goto LAB_0012865b;
        }
        uVar13 = uVar13 + 1;
        if (uVar13 == hash_set.size) {
          uVar13 = 0;
        }
        if (uVar13 == uVar12) {
          ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-impl.h"
                     ,0x105,"fatal error");
        }
      } while( true );
    }
    pcVar11 = "src->data && \"graph must be allocated\"";
    line = 0x68a;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/ggml-backend.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar11);
}

Assistant:

static struct ggml_tensor * graph_copy_dup_tensor(struct ggml_hash_set hash_set, struct ggml_tensor ** node_copies,
    struct ggml_context * ctx_allocated, struct ggml_context * ctx_unallocated, struct ggml_tensor * src) {

    GGML_ASSERT(src != NULL);
    GGML_ASSERT(src->data && "graph must be allocated");

    size_t id = ggml_hash_insert(&hash_set, src);
    if (id == GGML_HASHSET_ALREADY_EXISTS) {
        return node_copies[ggml_hash_find(&hash_set, src)];
    }

    struct ggml_tensor * dst = ggml_dup_tensor_layout(src->data && !src->view_src ? ctx_allocated : ctx_unallocated, src);
    if (src->view_src != NULL) {
        dst->view_src = graph_copy_dup_tensor(hash_set, node_copies, ctx_allocated, ctx_unallocated, src->view_src);
        dst->view_offs = src->view_offs;
    }
    dst->op = src->op;
    memcpy(dst->op_params, src->op_params, sizeof(dst->op_params));
    ggml_set_name(dst, src->name);

    // copy src
    for (int i = 0; i < GGML_MAX_SRC; i++) {
        struct ggml_tensor * s = src->src[i];
        if (s == NULL) {
            continue;
        }
        dst->src[i] = graph_copy_dup_tensor(hash_set, node_copies, ctx_allocated, ctx_unallocated, s);
    }

    node_copies[id] = dst;
    return dst;
}